

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

FloatParts int_to_float(int64_t a,int scale,float_status *status)

{
  ulong uVar1;
  uint64_t uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  FloatParts FVar6;
  
  if (a != 0) {
    uVar5 = -a;
    if (0 < a) {
      uVar5 = a;
    }
    uVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar3 = -0x10000;
    if (-0x10000 < scale) {
      iVar3 = scale;
    }
    if (0xffff < iVar3) {
      iVar3 = 0x10000;
    }
    uVar4 = (ulong)(uint)(iVar3 + (int)uVar1) | (ulong)a >> 0x17 & 0x10000000000 | 0x200000000;
    uVar2 = 0x4000000000000000;
    if ((uVar1 ^ 0x3f) != 0) {
      uVar2 = uVar5 << ((char)(uVar1 ^ 0x3f) - 1U & 0x3f);
    }
    FVar6.exp = (int)uVar4;
    FVar6.cls = (char)(uVar4 >> 0x20);
    FVar6.sign = (_Bool)(char)(uVar4 >> 0x28);
    FVar6._14_2_ = (short)(uVar4 >> 0x30);
    FVar6.frac = uVar2;
    return FVar6;
  }
  return (FloatParts)(ZEXT816(0x100000000) << 0x40);
}

Assistant:

static FloatParts int_to_float(int64_t a, int scale, float_status *status)
{
    FloatParts r = { .sign = false };

    if (a == 0) {
        r.cls = float_class_zero;
    } else {
        uint64_t f = a;
        int shift;

        r.cls = float_class_normal;
        if (a < 0) {
#ifdef _MSC_VER
            f = 0ULL - f;
#else
            f = -f;
#endif
            r.sign = true;
        }
        shift = clz64(f) - 1;
        scale = MIN(MAX(scale, -0x10000), 0x10000);

        r.exp = DECOMPOSED_BINARY_POINT - shift + scale;
        r.frac = (shift < 0 ? DECOMPOSED_IMPLICIT_BIT : f << shift);
    }

    return r;
}